

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  runtime_error *prVar3;
  streambuf *psVar4;
  undefined8 uVar5;
  anon_class_8_1_3fcf653c local_a00;
  functor_response local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  anon_class_24_3_df3538ba local_9b0;
  functor_response local_998;
  allocator<char> local_971;
  string local_970;
  undefined1 local_950 [8];
  server_t s;
  CallbackFunction local_660;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  undefined1 local_5f0 [8];
  Template temp;
  Environment env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  char *local_3e0;
  char *errmsg;
  string ss;
  stringstream buf;
  undefined1 local_3a8 [376];
  undefined1 local_230 [8];
  ifstream file;
  undefined8 uStack_10;
  int r;
  sqlite3 *db;
  
  uStack_10 = 0;
  iVar2 = sqlite3_open("bbs.db",&stack0xfffffffffffffff0);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"can\'t open database");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_230,"schema.sql",8);
  std::__cxx11::stringstream::stringstream((stringstream *)(ss.field_2._M_local_buf + 8));
  psVar4 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3a8,psVar4);
  std::__cxx11::stringstream::str();
  uVar1 = uStack_10;
  local_3e0 = (char *)0x0;
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = sqlite3_exec(uVar1,uVar5,0,0,&local_3e0);
  if (iVar2 != 0) {
    std::__cxx11::string::operator=((string *)&errmsg,local_3e0);
    sqlite3_free(local_3e0);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_400,"can\'t execute schema.sql: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errmsg);
    std::runtime_error::runtime_error(prVar3,(string *)&local_400);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  inja::Environment::Environment((Environment *)((long)&temp.content.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"./index.html",&local_611)
  ;
  inja::Environment::parse_template
            ((Template *)local_5f0,(Environment *)((long)&temp.content.field_2 + 8),&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"escape",&local_639);
  std::
  function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>(std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*>>&)>
  ::function<main::__0,void>
            ((function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>(std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*>>&)>
              *)&local_660,(anon_class_1_0_00000001 *)&s.log.field_0x187);
  inja::Environment::add_callback
            ((Environment *)((long)&temp.content.field_2 + 8),&local_638,1,&local_660);
  std::
  function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&)>
  ::~function(&local_660);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  clask::server();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"/",&local_971);
  local_9b0.db = (sqlite3 **)&stack0xfffffffffffffff0;
  local_9b0.env = (Environment *)((long)&temp.content.field_2 + 8);
  local_9b0.temp = (Template *)local_5f0;
  std::function<clask::response(clask::request&)>::function<main::__1,void>
            ((function<clask::response(clask::request&)> *)&local_998,&local_9b0);
  clask::server_t::GET((server_t *)local_950,&local_970,&local_998);
  std::function<clask::response_(clask::request_&)>::~function(&local_998);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator(&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"/post",&local_9d1);
  local_a00.db = (sqlite3 **)&stack0xfffffffffffffff0;
  std::function<clask::response(clask::request&)>::function<main::__2,void>
            ((function<clask::response(clask::request&)> *)&local_9f8,&local_a00);
  clask::server_t::POST((server_t *)local_950,&local_9d0,&local_9f8);
  std::function<clask::response_(clask::request_&)>::~function(&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  clask::server_t::run((server_t *)local_950,0x1f90);
  clask::server_t::~server_t((server_t *)local_950);
  inja::Template::~Template((Template *)local_5f0);
  inja::Environment::~Environment((Environment *)((long)&temp.content.field_2 + 8));
  std::__cxx11::string::~string((string *)&errmsg);
  std::__cxx11::stringstream::~stringstream((stringstream *)(ss.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_230);
  return 0;
}

Assistant:

int main() {
  sqlite3 *db = nullptr;
  int r = sqlite3_open("bbs.db", &db);
  if (SQLITE_OK != r) {
    throw std::runtime_error("can't open database");
  }
  std::ifstream file("schema.sql");
  std::stringstream buf;
  buf << file.rdbuf();
  std::string ss = buf.str();
  char* errmsg = nullptr;
  r = sqlite3_exec(db, ss.c_str(), nullptr, nullptr, &errmsg);
  if (SQLITE_OK != r) {
    ss = errmsg;
    sqlite3_free(errmsg);
    throw std::runtime_error("can't execute schema.sql: " + ss);
  }

  inja::Environment env;
  inja::Template temp = env.parse_template("./index.html");
  env.add_callback("escape", 1, [](inja::Arguments& args) {
    return clask::html_encode(args.at(0)->get<std::string>());
  });
  auto s = clask::server();

  s.GET("/", [&](clask::request& req) -> clask::response {
    nlohmann::json data;
    auto sql = "select id, text from bbs order by created";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    int n = 0;
    data["posts"] = {};
    while (SQLITE_DONE != sqlite3_step(stmt)) {
      data["posts"][n]["id"] = (std::string) (char*) sqlite3_column_text(stmt, 0);
      data["posts"][n]["text"] = (std::string) (char*) sqlite3_column_text(stmt, 1);
      n++;
    }
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 200,
      .content = env.render(temp, data),
    };
  });

  s.POST("/post", [&](clask::request& req) -> clask::response {
    auto params = clask::params(req.body);
    auto q = params["text"];
    if (q.empty()) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    auto sql = "insert into bbs(text) values(?)";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    sqlite3_bind_text(stmt, 1, q.c_str(), -1,
      (sqlite3_destructor_type) SQLITE_TRANSIENT);
    sqlite3_step(stmt);
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 302,
      .headers = {
        { "Location", "/" },
      },
    };
  });

  s.run();
}